

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd7 *p;
  IPpmd7_RangeDec *rc;
  rar_br *br;
  int *piVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  undefined8 uVar16;
  int iVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  void *pvVar21;
  void *__dest;
  uint uVar22;
  long lVar23;
  byte *pbVar24;
  uint uVar25;
  ulong uVar26;
  size_t local_38;
  
  pvVar4 = a->format->data;
  if (*(int *)((long)pvVar4 + 0x4ee8) == -1) {
    *(undefined4 *)((long)pvVar4 + 0x4ee8) = 0;
  }
  if (0 < *(long *)((long)pvVar4 + 0x98)) {
    __archive_read_consume(a,*(long *)((long)pvVar4 + 0x98));
    *(undefined8 *)((long)pvVar4 + 0x98) = 0;
  }
  if ((*(char *)((long)pvVar4 + 0xe5) == '\0') &&
     (*(long *)((long)pvVar4 + 0xc0) < *(long *)((long)pvVar4 + 0x28))) {
    if (*(byte *)((long)pvVar4 + 0x17) - 0x31 < 5) {
LAB_0020cb51:
      pbVar24 = (byte *)a->format->data;
      p = (CPpmd7 *)(pbVar24 + 0x370);
      rc = (IPpmd7_RangeDec *)(pbVar24 + 0x4e60);
      uVar26 = 0;
      do {
        if (pbVar24[200] == 0) {
LAB_0020d763:
          iVar7 = -0x1e;
          goto LAB_0020d768;
        }
        if (pbVar24[0x36a] != 0) {
LAB_0020d790:
          uVar6 = *(uint *)(pbVar24 + 0xcc);
          if ((ulong)uVar6 != 0) {
            pvVar4 = *(void **)(pbVar24 + 0xd8);
            *buff = pvVar4;
            *size = (ulong)uVar6;
            lVar15 = *(long *)(pbVar24 + 0xb8);
            *offset = lVar15;
            *(size_t *)(pbVar24 + 0xb8) = lVar15 + *size;
            uVar16 = crc32(*(undefined8 *)(pbVar24 + 0xe8),pvVar4,(int)*size);
            *(undefined8 *)(pbVar24 + 0xe8) = uVar16;
            pbVar24[0xcc] = 0;
            pbVar24[0xcd] = 0;
            pbVar24[0xce] = 0;
            pbVar24[0xcf] = 0;
            return 0;
          }
          *buff = (void *)0x0;
          *size = 0;
          *offset = *(int64_t *)(pbVar24 + 0xb0);
          if (*(long *)(pbVar24 + 8) == *(long *)(pbVar24 + 0xe8)) {
            pbVar24[0xe5] = 1;
            iVar7 = 1;
            goto LAB_0020d768;
          }
          pcVar18 = "File CRC error";
LAB_0020d754:
          archive_set_error(&a->archive,0x54,pcVar18);
          goto LAB_0020d763;
        }
        if (*(int *)(pbVar24 + 0xe0) != 0) {
          if (*(long *)(pbVar24 + 0x28) <= *(long *)(pbVar24 + 0xb0)) goto LAB_0020d790;
          if ((pbVar24[0x36b] != 0) || (uVar20 = *(ulong *)(pbVar24 + 0xa8), (long)uVar20 < 1))
          goto LAB_0020cbda;
          uVar26 = (ulong)(uint)(*(int *)(pbVar24 + 0xd0) - *(int *)(pbVar24 + 0xcc));
          if (uVar20 < (uint)(*(int *)(pbVar24 + 0xd0) - *(int *)(pbVar24 + 0xcc))) {
            uVar26 = uVar20;
          }
          uVar6 = copy_from_lzss_window(a,buff,*(long *)(pbVar24 + 0xb0),(int)uVar26);
          if (uVar6 != 0) {
LAB_0020d879:
            uVar26 = (ulong)uVar6;
            goto LAB_0020d87c;
          }
          *(ulong *)(pbVar24 + 0xb0) = *(long *)(pbVar24 + 0xb0) + uVar26;
          *(ulong *)(pbVar24 + 0xa8) = *(long *)(pbVar24 + 0xa8) - uVar26;
          pvVar14 = *buff;
          if (pvVar14 == (void *)0x0) {
            pvVar14 = (void *)0x0;
            uVar26 = 0;
            goto LAB_0020d648;
          }
          pbVar24[0xcc] = 0;
          pbVar24[0xcd] = 0;
          pbVar24[0xce] = 0;
          pbVar24[0xcf] = 0;
          *size = (ulong)*(uint *)(pbVar24 + 0xd0);
          lVar15 = *(long *)(pbVar24 + 0xb8);
          *offset = lVar15;
          *(size_t *)(pbVar24 + 0xb8) = lVar15 + *size;
          uVar16 = *(undefined8 *)(pbVar24 + 0xe8);
          local_38 = (size_t)(uint)*size;
          goto LAB_0020d730;
        }
LAB_0020cbda:
        if ((*(long *)(pbVar24 + 0x4ee0) == 0) &&
           (uVar26 = 0, 0 < *(long *)((long)a->format->data + 0xa0))) {
          pvVar14 = rar_read_ahead(a,1,(ssize_t *)(pbVar24 + 0x4ed8));
          *(void **)(pbVar24 + 0x4ee0) = pvVar14;
          if (pvVar14 == (void *)0x0) {
            pcVar18 = "Truncated RAR file data";
            goto LAB_0020d754;
          }
          if (*(int *)(pbVar24 + 0x4ed0) == 0) {
            rar_br_fillup(a,(rar_br *)(pbVar24 + 0x4ec8));
          }
        }
        if (pbVar24[0x368] != 0) {
          uVar6 = parse_codes(a);
          uVar26 = (ulong)uVar6;
          if (-0x15 < (int)uVar6) goto LAB_0020cc06;
          goto LAB_0020d87c;
        }
LAB_0020cc06:
        if (pbVar24[0x36b] == 0) {
          lVar15 = *(long *)(pbVar24 + 0xb0);
          lVar23 = (ulong)*(uint *)(pbVar24 + 0xe0) + lVar15;
          pbVar24[0x360] = 0xff;
          pbVar24[0x361] = 0xff;
          pbVar24[0x362] = 0xff;
          pbVar24[0x363] = 0xff;
          pbVar24[0x364] = 0xff;
          pbVar24[0x365] = 0xff;
          pbVar24[0x366] = 0xff;
          pbVar24[0x367] = 0x7f;
          pvVar14 = a->format->data;
          br = (rar_br *)((long)pvVar14 + 0x4ec8);
          if (*(long *)((long)pvVar14 + 0x360) < lVar23) {
            lVar23 = *(long *)((long)pvVar14 + 0x360);
          }
          piVar1 = (int *)((long)pvVar14 + 0x344);
LAB_0020cd80:
          while( true ) {
            uVar26 = *(ulong *)((long)pvVar14 + 0x330);
            if (*(char *)((long)pvVar14 + 0x338) != '\0') {
              uVar6 = *(uint *)((long)pvVar14 + 0x33c);
              if (lVar23 < (long)(uVar26 + uVar6)) goto LAB_0020d5e0;
              if (0 < (int)uVar6) {
                uVar10 = *(uint *)((long)pvVar14 + 0x328);
                uVar25 = (uint)uVar26 & uVar10;
                uVar19 = uVar25 - *(int *)((long)pvVar14 + 0x340) & uVar10;
                uVar13 = uVar6;
                do {
                  uVar9 = uVar19;
                  if ((int)uVar19 < (int)uVar25) {
                    uVar9 = uVar25;
                  }
                  uVar9 = (uVar10 - uVar9) + 1;
                  if ((int)uVar13 < (int)uVar9) {
                    uVar9 = uVar13;
                  }
                  __dest = (void *)((long)(int)uVar25 + *(long *)((long)pvVar14 + 800));
                  pvVar21 = (void *)(*(long *)((long)pvVar14 + 800) + (long)(int)uVar19);
                  if (((int)(uVar25 + uVar9) < (int)uVar19) || ((int)(uVar19 + uVar9) < (int)uVar25)
                     ) {
                    memcpy(__dest,pvVar21,(long)(int)uVar9);
                  }
                  else if (0 < (int)uVar9) {
                    uVar26 = 0;
                    do {
                      *(undefined1 *)((long)__dest + uVar26) =
                           *(undefined1 *)((long)pvVar21 + uVar26);
                      uVar26 = uVar26 + 1;
                    } while (uVar9 != uVar26);
                  }
                  uVar10 = *(uint *)((long)pvVar14 + 0x328);
                  uVar25 = uVar25 + uVar9 & uVar10;
                  uVar19 = uVar19 + uVar9 & uVar10;
                  uVar22 = uVar13 - uVar9;
                  bVar5 = (int)uVar9 <= (int)uVar13;
                  uVar13 = uVar22;
                } while (uVar22 != 0 && bVar5);
                uVar26 = *(ulong *)((long)pvVar14 + 0x330);
              }
              uVar26 = uVar26 + (long)(int)uVar6;
              *(ulong *)((long)pvVar14 + 0x330) = uVar26;
              *(undefined1 *)((long)pvVar14 + 0x338) = 0;
            }
            if ((*(char *)((long)pvVar14 + 0x36b) != '\0') || (lVar23 <= (long)uVar26))
            goto LAB_0020d5e0;
            uVar6 = read_next_symbol(a,(huffman_code *)((long)pvVar14 + 0x108));
            if ((int)uVar6 < 0) goto LAB_0020d763;
            *(undefined1 *)((long)pvVar14 + 0x338) = 0;
            if (0xff < uVar6) break;
            *(char *)(*(long *)((long)pvVar14 + 800) +
                     (long)(int)(*(uint *)((long)pvVar14 + 0x328) & *(uint *)((long)pvVar14 + 0x330)
                                )) = (char)uVar6;
            *(long *)((long)pvVar14 + 0x330) = *(long *)((long)pvVar14 + 0x330) + 1;
          }
          if (uVar6 != 0x100) {
            if (uVar6 == 0x102) goto LAB_0020cfd7;
            if (uVar6 == 0x101) goto switchD_0020cc68_caseD_3;
            if (0x106 < uVar6) {
              if (uVar6 < 0x10f) {
                bVar2 = *(byte *)((long)&expand_shortbases + (ulong)(uVar6 - 0x107));
                bVar3 = *(byte *)((long)&expand_shortbits + (ulong)(uVar6 - 0x107));
                iVar7 = *(int *)((long)pvVar14 + 0x4ed0);
                if (iVar7 < (int)(uint)bVar3) {
                  iVar8 = rar_br_fillup(a,br);
                  iVar7 = *(int *)((long)pvVar14 + 0x4ed0);
                  if ((iVar8 == 0) && (iVar7 < (int)(uint)bVar3)) goto LAB_0020d90b;
                }
                iVar7 = iVar7 - (uint)bVar3;
                iVar8 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ec8) >> ((byte)iVar7 & 0x3f)) &
                        cache_masks[bVar3]) + bVar2 + 1;
                *(int *)((long)pvVar14 + 0x4ed0) = iVar7;
                *(undefined4 *)((long)pvVar14 + 0x350) = *(undefined4 *)((long)pvVar14 + 0x34c);
                *(undefined8 *)((long)pvVar14 + 0x348) = *(undefined8 *)piVar1;
                *(int *)((long)pvVar14 + 0x344) = iVar8;
                iVar7 = 2;
                goto LAB_0020d2e8;
              }
              if (uVar6 < 300) {
                uVar6 = uVar6 - 0x10f;
                iVar7 = (byte)expand_lengthbases[uVar6] + 3;
                if (7 < uVar6) {
                  bVar2 = expand_lengthbits[uVar6];
                  iVar8 = *(int *)((long)pvVar14 + 0x4ed0);
                  if (iVar8 < (int)(uint)bVar2) {
                    iVar17 = rar_br_fillup(a,br);
                    iVar8 = *(int *)((long)pvVar14 + 0x4ed0);
                    if ((iVar17 == 0) && (iVar8 < (int)(uint)bVar2)) goto LAB_0020d90b;
                  }
                  iVar8 = iVar8 - (uint)bVar2;
                  iVar7 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ec8) >> ((byte)iVar8 & 0x3f)) &
                          cache_masks[bVar2]) + iVar7;
                  *(int *)((long)pvVar14 + 0x4ed0) = iVar8;
                }
                uVar6 = read_next_symbol(a,(huffman_code *)((long)pvVar14 + 0x128));
                if (uVar6 < 0x3d) {
                  uVar26 = (ulong)uVar6;
                  iVar8 = *(int *)(expand_offsetbases + uVar26 * 4) + 1;
                  if (3 < uVar6) {
                    bVar2 = expand_offsetbits[uVar26];
                    if (uVar6 < 10) {
                      iVar17 = *(int *)((long)pvVar14 + 0x4ed0);
                      if (iVar17 < (int)(uint)bVar2) {
                        iVar11 = rar_br_fillup(a,br);
                        iVar17 = *(int *)((long)pvVar14 + 0x4ed0);
                        if ((iVar11 == 0) && (iVar17 < (int)(uint)bVar2)) goto LAB_0020d90b;
                      }
                      iVar17 = iVar17 - (uint)bVar2;
                      iVar8 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ec8) >> ((byte)iVar17 & 0x3f)) &
                              cache_masks[bVar2]) + iVar8;
                      *(int *)((long)pvVar14 + 0x4ed0) = iVar17;
                    }
                    else {
                      if (uVar26 - 0xc < 0x30) {
                        iVar17 = *(int *)((long)pvVar14 + 0x4ed0);
                        iVar11 = bVar2 - 4;
                        if (iVar17 < iVar11) {
                          iVar12 = rar_br_fillup(a,br);
                          iVar17 = *(int *)((long)pvVar14 + 0x4ed0);
                          if ((iVar12 == 0) && (iVar17 < iVar11)) goto LAB_0020d90b;
                        }
                        iVar8 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ec8) >>
                                       ((byte)(iVar17 - iVar11) & 0x3f)) & (&UINT_00266690)[bVar2])
                                * 0x10 + iVar8;
                        *(int *)((long)pvVar14 + 0x4ed0) = iVar17 - iVar11;
                      }
                      if (*(int *)((long)pvVar14 + 0x358) == 0) {
                        iVar17 = read_next_symbol(a,(huffman_code *)((long)pvVar14 + 0x148));
                        if (iVar17 < 0) goto LAB_0020d763;
                        if (iVar17 == 0x10) {
                          *(undefined4 *)((long)pvVar14 + 0x358) = 0xf;
                          iVar8 = iVar8 + *(int *)((long)pvVar14 + 0x354);
                        }
                        else {
                          iVar8 = iVar8 + iVar17;
                          *(int *)((long)pvVar14 + 0x354) = iVar17;
                        }
                      }
                      else {
                        *(int *)((long)pvVar14 + 0x358) = *(int *)((long)pvVar14 + 0x358) + -1;
                        iVar8 = iVar8 + *(int *)((long)pvVar14 + 0x354);
                      }
                    }
                  }
                  *(undefined4 *)((long)pvVar14 + 0x350) = *(undefined4 *)((long)pvVar14 + 0x34c);
                  *(undefined8 *)((long)pvVar14 + 0x348) = *(undefined8 *)piVar1;
                  iVar7 = iVar7 + (uint)(0x3ffff < iVar8) + (uint)(0x1fff < iVar8);
                  *piVar1 = iVar8;
                  goto LAB_0020d2e8;
                }
              }
LAB_0020d8ff:
              pcVar18 = "Bad RAR file data";
              goto LAB_0020d754;
            }
            iVar8 = piVar1[uVar6 - 0x103];
            uVar10 = read_next_symbol(a,(huffman_code *)((long)pvVar14 + 0x168));
            if (0x1c < uVar10) goto LAB_0020d8ff;
            iVar7 = (byte)expand_lengthbases[uVar10] + 2;
            if (7 < uVar10) {
              bVar2 = expand_lengthbits[uVar10];
              iVar17 = *(int *)((long)pvVar14 + 0x4ed0);
              if (iVar17 < (int)(uint)bVar2) {
                iVar11 = rar_br_fillup(a,br);
                iVar17 = *(int *)((long)pvVar14 + 0x4ed0);
                if ((iVar11 == 0) && (iVar17 < (int)(uint)bVar2)) goto LAB_0020d90b;
              }
              iVar17 = iVar17 - (uint)bVar2;
              iVar7 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ec8) >> ((byte)iVar17 & 0x3f)) &
                      cache_masks[bVar2]) + iVar7;
              *(int *)((long)pvVar14 + 0x4ed0) = iVar17;
            }
            uVar26 = (ulong)(uVar6 - 0x103);
            if (0x103 < uVar6) {
              do {
                piVar1[uVar26] = *(int *)((long)pvVar14 + uVar26 * 4 + 0x340);
                bVar5 = 1 < uVar26;
                uVar26 = uVar26 - 1;
              } while (bVar5);
            }
            *piVar1 = iVar8;
            goto LAB_0020d2e8;
          }
          iVar7 = *(int *)((long)pvVar14 + 0x4ed0);
          if (iVar7 < 1) {
            iVar8 = rar_br_fillup(a,br);
            iVar7 = *(int *)((long)pvVar14 + 0x4ed0);
            if (iVar7 < 1 && iVar8 == 0) goto LAB_0020d90b;
          }
          uVar26 = *(ulong *)((long)pvVar14 + 0x4ec8);
          uVar6 = iVar7 - 1;
          *(uint *)((long)pvVar14 + 0x4ed0) = uVar6;
          if ((uVar26 >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
            iVar7 = parse_codes(a);
            if (iVar7 != 0) goto LAB_0020d763;
            goto LAB_0020cd80;
          }
          *(undefined1 *)((long)pvVar14 + 0xe4) = 1;
          if (iVar7 < 2) {
            iVar7 = rar_br_fillup(a,br);
            uVar6 = *(uint *)((long)pvVar14 + 0x4ed0);
            if ((int)uVar6 < 1 && iVar7 == 0) {
LAB_0020d90b:
              archive_set_error(&a->archive,0x54,"Truncated RAR file data");
              *(undefined1 *)((long)pvVar14 + 200) = 0;
              goto LAB_0020d763;
            }
            uVar26 = br->cache_buffer;
          }
          *(bool *)((long)pvVar14 + 0x368) = (uVar26 >> ((ulong)(uVar6 - 1) & 0x3f) & 1) != 0;
          *(uint *)((long)pvVar14 + 0x4ed0) = uVar6 - 1;
          uVar26 = *(ulong *)((long)pvVar14 + 0x330);
LAB_0020d5e0:
          if ((long)uVar26 < 0) goto LAB_0020d87c;
          uVar26 = uVar26 - lVar15;
          *(ulong *)(pbVar24 + 0xa8) = uVar26;
          if (uVar26 == 0) {
            pcVar18 = "Internal error extracting RAR file";
            goto LAB_0020d754;
          }
        }
        else {
          iVar7 = Ppmd7_DecodeSymbol(p,rc);
          if (iVar7 < 0) {
LAB_0020d74d:
            pcVar18 = "Invalid symbol";
            goto LAB_0020d754;
          }
          if (iVar7 == *(int *)(pbVar24 + 0x36c)) {
            iVar8 = Ppmd7_DecodeSymbol(p,rc);
            if (iVar8 < 0) goto LAB_0020d74d;
            switch(iVar8) {
            case 0:
              goto switchD_0020cc68_caseD_0;
            default:
              goto switchD_0020cc68_caseD_1;
            case 2:
              pbVar24[0x36a] = 1;
              goto LAB_0020d63f;
            case 3:
switchD_0020cc68_caseD_3:
              archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
              iVar7 = -0x19;
              goto LAB_0020d768;
            case 4:
              uVar6 = 0;
              iVar7 = 0x10;
              do {
                iVar8 = Ppmd7_DecodeSymbol(p,rc);
                if (iVar8 < 0) goto LAB_0020d74d;
                uVar6 = uVar6 | iVar8 << ((byte)iVar7 & 0x1f);
                iVar7 = iVar7 + -8;
              } while (iVar7 != -8);
              iVar7 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar7 < 0) goto LAB_0020d74d;
              uVar25 = iVar7 + 0x20;
              uVar10 = *(uint *)(pbVar24 + 0x328);
              uVar13 = *(uint *)(pbVar24 + 0x330) & uVar10;
              uVar19 = (uVar13 - uVar6) - 2 & uVar10;
              uVar6 = uVar25;
              do {
                uVar9 = uVar19;
                if ((int)uVar19 < (int)uVar13) {
                  uVar9 = uVar13;
                }
                uVar9 = (uVar10 - uVar9) + 1;
                if ((int)uVar6 < (int)uVar9) {
                  uVar9 = uVar6;
                }
                pvVar21 = (void *)((long)(int)uVar13 + *(long *)(pbVar24 + 800));
                pvVar14 = (void *)(*(long *)(pbVar24 + 800) + (long)(int)uVar19);
                if (((int)(uVar9 + uVar13) < (int)uVar19) || ((int)(uVar9 + uVar19) < (int)uVar13))
                {
                  memcpy(pvVar21,pvVar14,(long)(int)uVar9);
                }
                else if (0 < (int)uVar9) {
                  uVar26 = 0;
                  do {
                    *(undefined1 *)((long)pvVar21 + uVar26) =
                         *(undefined1 *)((long)pvVar14 + uVar26);
                    uVar26 = uVar26 + 1;
                  } while (uVar9 != uVar26);
                }
                uVar10 = *(uint *)(pbVar24 + 0x328);
                uVar13 = uVar9 + uVar13 & uVar10;
                uVar19 = uVar9 + uVar19 & uVar10;
                uVar22 = uVar6 - uVar9;
                bVar5 = (int)uVar9 <= (int)uVar6;
                uVar6 = uVar22;
              } while (uVar22 != 0 && bVar5);
              break;
            case 5:
              iVar7 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar7 < 0) goto LAB_0020d74d;
              uVar25 = iVar7 + 4;
              uVar6 = *(uint *)(pbVar24 + 0x328);
              uVar13 = *(uint *)(pbVar24 + 0x330) & uVar6;
              uVar19 = uVar13 - 1 & uVar6;
              uVar10 = uVar25;
              do {
                uVar9 = uVar19;
                if ((int)uVar19 < (int)uVar13) {
                  uVar9 = uVar13;
                }
                uVar9 = (uVar6 - uVar9) + 1;
                if ((int)uVar10 < (int)uVar9) {
                  uVar9 = uVar10;
                }
                pvVar21 = (void *)((long)(int)uVar13 + *(long *)(pbVar24 + 800));
                pvVar14 = (void *)(*(long *)(pbVar24 + 800) + (long)(int)uVar19);
                if (((int)(uVar9 + uVar13) < (int)uVar19) || ((int)(uVar9 + uVar19) < (int)uVar13))
                {
                  memcpy(pvVar21,pvVar14,(long)(int)uVar9);
                }
                else if (0 < (int)uVar9) {
                  uVar26 = 0;
                  do {
                    *(undefined1 *)((long)pvVar21 + uVar26) =
                         *(undefined1 *)((long)pvVar14 + uVar26);
                    uVar26 = uVar26 + 1;
                  } while (uVar9 != uVar26);
                }
                uVar6 = *(uint *)(pbVar24 + 0x328);
                uVar13 = uVar9 + uVar13 & uVar6;
                uVar19 = uVar9 + uVar19 & uVar6;
                uVar22 = uVar10 - uVar9;
                bVar5 = (int)uVar9 <= (int)uVar10;
                uVar10 = uVar22;
              } while (uVar22 != 0 && bVar5);
            }
            uVar26 = (ulong)uVar25;
            lVar15 = *(long *)(pbVar24 + 0x330) + uVar26;
          }
          else {
switchD_0020cc68_caseD_1:
            *(char *)(*(long *)(pbVar24 + 800) +
                     (long)(int)(*(uint *)(pbVar24 + 0x328) & *(uint *)(pbVar24 + 0x330))) =
                 (char)iVar7;
            lVar15 = *(long *)(pbVar24 + 0x330) + 1;
            uVar26 = 1;
          }
          *(long *)(pbVar24 + 0x330) = lVar15;
          uVar26 = uVar26 + *(long *)(pbVar24 + 0xa8);
          *(ulong *)(pbVar24 + 0xa8) = uVar26;
        }
        uVar20 = (ulong)(uint)(*(int *)(pbVar24 + 0xd0) - *(int *)(pbVar24 + 0xcc));
        if ((long)uVar26 < (long)(ulong)(uint)(*(int *)(pbVar24 + 0xd0) - *(int *)(pbVar24 + 0xcc)))
        {
          uVar20 = uVar26;
        }
        uVar6 = copy_from_lzss_window(a,buff,*(int64_t *)(pbVar24 + 0xb0),(int)uVar20);
        if (uVar6 != 0) goto LAB_0020d879;
        *(ulong *)(pbVar24 + 0xb0) = *(long *)(pbVar24 + 0xb0) + uVar20;
        *(ulong *)(pbVar24 + 0xa8) = *(long *)(pbVar24 + 0xa8) - uVar20;
        uVar26 = 0;
LAB_0020d63f:
        pvVar14 = *buff;
LAB_0020d648:
        if (pvVar14 != (void *)0x0) {
          pbVar24[0xcc] = 0;
          pbVar24[0xcd] = 0;
          pbVar24[0xce] = 0;
          pbVar24[0xcf] = 0;
          *size = (ulong)*(uint *)(pbVar24 + 0xd0);
          lVar15 = *(long *)(pbVar24 + 0xb8);
          *offset = lVar15;
          *(size_t *)(pbVar24 + 0xb8) = lVar15 + *size;
          uVar16 = crc32(*(undefined8 *)(pbVar24 + 0xe8),pvVar14,(int)*size);
          *(undefined8 *)(pbVar24 + 0xe8) = uVar16;
LAB_0020d87c:
          iVar7 = (int)uVar26;
          if (iVar7 == -0x14) {
            return -0x14;
          }
          if (iVar7 == 0) {
            return 0;
          }
LAB_0020d768:
          Ppmd7_Free((CPpmd7 *)((long)pvVar4 + 0x370),&g_szalloc);
          return iVar7;
        }
      } while( true );
    }
    if (*(byte *)((long)pvVar4 + 0x17) == 0x30) {
      pbVar24 = (byte *)a->format->data;
      if ((*(long *)(pbVar24 + 0xa0) == 0) && (((*pbVar24 & 1) == 0 || ((pbVar24[0x18] & 2) == 0))))
      {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)(pbVar24 + 0xb0);
        if (*(long *)(pbVar24 + 8) == *(long *)(pbVar24 + 0xe8)) {
          pbVar24[0xe5] = 1;
          goto LAB_0020d695;
        }
        pcVar18 = "File CRC error";
      }
      else {
        pvVar14 = rar_read_ahead(a,1,(ssize_t *)&local_38);
        *buff = pvVar14;
        if (0 < (long)local_38) {
          *size = local_38;
          lVar15 = *(long *)(pbVar24 + 0xb0);
          *offset = lVar15;
          *(size_t *)(pbVar24 + 0xb0) = lVar15 + local_38;
          *(size_t *)(pbVar24 + 0xc0) = *(long *)(pbVar24 + 0xc0) + local_38;
          *(size_t *)(pbVar24 + 0xa0) = *(long *)(pbVar24 + 0xa0) - local_38;
          *(size_t *)(pbVar24 + 0x98) = local_38;
          uVar16 = *(undefined8 *)(pbVar24 + 0xe8);
LAB_0020d730:
          uVar16 = crc32(uVar16,pvVar14,local_38);
          *(undefined8 *)(pbVar24 + 0xe8) = uVar16;
          return 0;
        }
        pcVar18 = "Truncated RAR file data";
      }
    }
    else {
      pcVar18 = "Unsupported compression method for RAR file.";
    }
    archive_set_error(&a->archive,0x54,pcVar18);
    iVar7 = -0x1e;
  }
  else {
    *buff = (void *)0x0;
    *size = 0;
    lVar15 = *(long *)((long)pvVar4 + 0xb0);
    *offset = lVar15;
    lVar23 = *(long *)((long)pvVar4 + 0x28);
    if (*(long *)((long)pvVar4 + 0x28) < lVar15) {
      lVar23 = lVar15;
    }
    *offset = lVar23;
LAB_0020d695:
    iVar7 = 1;
  }
  return iVar7;
LAB_0020cfd7:
  iVar7 = *(int *)((long)pvVar14 + 0x33c);
  if (iVar7 == 0) goto LAB_0020cd80;
  iVar8 = *(int *)((long)pvVar14 + 0x340);
LAB_0020d2e8:
  *(int *)((long)pvVar14 + 0x340) = iVar8;
  *(int *)((long)pvVar14 + 0x33c) = iVar7;
  *(undefined1 *)((long)pvVar14 + 0x338) = 1;
  goto LAB_0020cd80;
switchD_0020cc68_caseD_0:
  pbVar24[0x368] = 1;
  goto LAB_0020cb51;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *buff = NULL;
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN)
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}